

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCEXP.hpp
# Opt level: O2

void CCEXP::AddVal<short>(CCEXP *obj,char *matname,short val)

{
  size_t sel;
  
  obj->ErrorId = 0;
  sel = CCEXP::getTableIndexByName(obj,matname);
  if (sel != 0xffffffffffffffff) {
    AddVal<short>(obj,sel,val);
    return;
  }
  CECS::RecError((CECS *)CCEXPECS,-9999,1,"CCEXP.hpp",0x2b5,
                 "[%s]: AddVal():: Failed to find table with name [%s]!",obj->SavingFile,matname);
  return;
}

Assistant:

void AddVal(
	CCEXP &obj, const char* matname, T val
) {
	obj.ErrorId = 0;
	size_t sel = obj.getTableIndexByName(matname);
	CECS_ERR(CCEXPECS,sel == MAXSIZE_T,"[%s]: AddVal():: Failed to find table with name [%s]!", obj.SavingFile, matname);
	AddVal(obj, sel, val);
}